

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  GLFWbool GVar2;
  char *string;
  char *__s1;
  long lVar3;
  char *in_RDI;
  char *extensions;
  char *en;
  GLint count;
  int i;
  _GLFWwindow *window;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar4;
  int local_4;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_4 = 0;
  }
  else {
    string = (char *)_glfwPlatformGetTls((_GLFWtls *)0x9be5e5);
    if (string == (char *)0x0) {
      _glfwInputError(0x10002,"Cannot query extension without a current OpenGL or OpenGL ES context"
                     );
      local_4 = 0;
    }
    else if (*in_RDI == '\0') {
      _glfwInputError(0x10004,"Extension name cannot be an empty string");
      local_4 = 0;
    }
    else {
      if (*(int *)(string + 0x218) < 3) {
        lVar3 = (**(code **)(string + 0x250))(0x1f03);
        if (lVar3 == 0) {
          _glfwInputError(0x10008,"Extension string retrieval is broken");
          return 0;
        }
        GVar2 = _glfwStringInExtensionString
                          (string,(char *)CONCAT44(in_stack_ffffffffffffffe4,
                                                   in_stack_ffffffffffffffe0));
        if (GVar2 != 0) {
          return 1;
        }
      }
      else {
        (**(code **)(string + 0x248))(0x821d,&stack0xffffffffffffffe0);
        for (iVar4 = 0; iVar4 < in_stack_ffffffffffffffe0; iVar4 = iVar4 + 1) {
          __s1 = (char *)(**(code **)(string + 0x240))(0x1f03,iVar4);
          if (__s1 == (char *)0x0) {
            _glfwInputError(0x10008,"Extension string retrieval is broken");
            return 0;
          }
          iVar1 = strcmp(__s1,in_RDI);
          if (iVar1 == 0) {
            return 1;
          }
        }
      }
      local_4 = (**(code **)(string + 0x270))(in_RDI);
    }
  }
  return local_4;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    _GLFWwindow* window;
    assert(extension != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    window = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT,
                        "Cannot query extension without a current OpenGL or OpenGL ES context");
        return GLFW_FALSE;
    }

    if (*extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Extension name cannot be an empty string");
        return GLFW_FALSE;
    }

    if (window->context.major >= 3)
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        window->context.GetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*)
                window->context.GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Extension string retrieval is broken");
                return GLFW_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GLFW_TRUE;
        }
    }
    else
    {
        // Check if extension is in the old style OpenGL extensions string

        const char* extensions = (const char*)
            window->context.GetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Extension string retrieval is broken");
            return GLFW_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GLFW_TRUE;
    }

    // Check if extension is in the platform-specific string
    return window->context.extensionSupported(extension);
}